

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::WindowDataParameter::InternalSerializeWithCachedSizesToArray
          (WindowDataParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  char *pcVar5;
  string *psVar6;
  UnknownFieldSet *unknown_fields;
  float fVar7;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  WindowDataParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 1) != 0) {
    source_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    source_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.source");
    psVar6 = source_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray(1,psVar6,target);
  }
  if ((uVar1 & 0x200) != 0) {
    fVar7 = scale(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(2,fVar7,puStack_40);
  }
  if ((uVar1 & 2) != 0) {
    mean_file_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    mean_file_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.mean_file");
    psVar6 = mean_file_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,psVar6,puStack_40)
    ;
  }
  if ((uVar1 & 0x10) != 0) {
    uVar4 = batch_size(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4,uVar4,puStack_40);
  }
  if ((uVar1 & 0x20) != 0) {
    uVar4 = crop_size(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5,uVar4,puStack_40);
  }
  if ((uVar1 & 0x40) != 0) {
    bVar2 = mirror(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(6,bVar2,puStack_40);
  }
  if ((uVar1 & 0x400) != 0) {
    fVar7 = fg_threshold(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(7,fVar7,puStack_40);
  }
  if ((uVar1 & 0x800) != 0) {
    fVar7 = bg_threshold(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(8,fVar7,puStack_40);
  }
  if ((uVar1 & 0x1000) != 0) {
    fVar7 = fg_fraction(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(9,fVar7,puStack_40);
  }
  if ((uVar1 & 0x100) != 0) {
    uVar4 = context_pad(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10,uVar4,puStack_40)
    ;
  }
  if ((uVar1 & 4) != 0) {
    crop_mode_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    crop_mode_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.crop_mode");
    psVar6 = crop_mode_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                           (0xb,psVar6,puStack_40);
  }
  if ((uVar1 & 0x80) != 0) {
    bVar2 = cache_images(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0xc,bVar2,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    root_folder_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    root_folder_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.WindowDataParameter.root_folder");
    psVar6 = root_folder_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                           (0xd,psVar6,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = WindowDataParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* WindowDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.WindowDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->source(), target);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->scale(), target);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.mean_file");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->mean_file(), target);
  }

  // optional uint32 batch_size = 4;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4, this->batch_size(), target);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5, this->crop_size(), target);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->mirror(), target);
  }

  // optional float fg_threshold = 7 [default = 0.5];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(7, this->fg_threshold(), target);
  }

  // optional float bg_threshold = 8 [default = 0.5];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(8, this->bg_threshold(), target);
  }

  // optional float fg_fraction = 9 [default = 0.25];
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(9, this->fg_fraction(), target);
  }

  // optional uint32 context_pad = 10 [default = 0];
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->context_pad(), target);
  }

  // optional string crop_mode = 11 [default = "warp"];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->crop_mode().data(), this->crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.crop_mode");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        11, this->crop_mode(), target);
  }

  // optional bool cache_images = 12 [default = false];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(12, this->cache_images(), target);
  }

  // optional string root_folder = 13 [default = ""];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->root_folder().data(), this->root_folder().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.WindowDataParameter.root_folder");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        13, this->root_folder(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.WindowDataParameter)
  return target;
}